

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O2

void doit(bool skipheader,bool index_file)

{
  FILE *__stream;
  FILE *__stream_00;
  size_t sVar1;
  undefined7 in_register_00000039;
  VulnerabilityIndex idx;
  int damage_bins;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    puts("vulnerability_id,intensity_bin_id,damage_bin_id,probability");
  }
  if (index_file) {
    __stream = fopen("vulnerability.bin","rb");
    __stream_00 = fopen("vulnerability.idx","rb");
    if (__stream_00 == (FILE *)0x0) {
      fwrite("FATAL: Vulnerability idx open failed\n",0x25,1,_stderr);
      exit(1);
    }
    while (sVar1 = fread(&idx,0x1c,1,__stream_00), sVar1 != 0) {
      fseek(__stream,CONCAT44(idx.offset._4_4_,(uint)idx.offset),0);
      printrows(idx.vulnerability_id,(FILE *)__stream,CONCAT44(idx.size._4_4_,(float)idx.size));
    }
    fclose(__stream);
    fclose(__stream_00);
  }
  else {
    fread(&damage_bins,4,1,_stdin);
    sVar1 = fread(&idx,0x10,1,_stdin);
    while ((int)sVar1 != 0) {
      printf("%d, %d, %d, %.10e\n",(double)(float)idx.size,(ulong)(uint)idx.vulnerability_id,
             (ulong)(uint)idx.offset,(ulong)idx.offset._4_4_);
      sVar1 = fread(&idx,0x10,1,_stdin);
    }
  }
  return;
}

Assistant:

void doit(bool skipheader, bool index_file)
{

	if (skipheader == false) {
		printf("vulnerability_id,intensity_bin_id,damage_bin_id,"
		       "probability\n");
	}

	if (index_file) {

		const char *binFileName = "vulnerability.bin";
		const char *idxFileName = "vulnerability.idx";
		FILE *finx = fopen(binFileName, "rb");
		FILE *finy = fopen(idxFileName, "rb");
		if (finy == nullptr) {
			fprintf(stderr,
				"FATAL: Vulnerability idx open failed\n");
			exit(EXIT_FAILURE);
		}

		VulnerabilityIndex idx;
		size_t i = fread(&idx, sizeof(idx), 1, finy);
		while (i != 0) {
			flseek(finx, idx.offset, SEEK_SET);
			printrows(idx.vulnerability_id, finx, idx.size);
			i = fread(&idx, sizeof(idx), 1, finy);
		}

		fclose(finx);
		fclose(finy);

	} else {

		int damage_bins;
		// Drop the bins
		fread(&damage_bins, sizeof(damage_bins), 1, stdin);

		Vulnerability q;
		int i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf("%d, %d, %d, %.10e\n", q.vulnerability_id,
			       q.intensity_bin_id, q.damage_bin_id,
			       q.probability);
			i = fread(&q, sizeof(q), 1, stdin);
		}

	}

}